

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall CLIntercept::dumpKernelISABinaries(CLIntercept *this,cl_program program)

{
  double __x;
  cl_icd_dispatch *pcVar1;
  SConfig *pSVar2;
  CLIntercept *this_00;
  cl_program in_RSI;
  CLIntercept *in_RDI;
  cl_uint k_2;
  cl_device_type deviceType;
  string fileName;
  char *kernelISABinary;
  size_t kernelISABinarySize;
  cl_uint d;
  char *kernelName;
  cl_kernel kernel;
  cl_uint k_1;
  char numberString [256];
  string fileNamePrefix;
  SProgramInfo *programInfo;
  cl_device_id *deviceList;
  cl_uint numDevices;
  cl_uint k;
  cl_kernel *kernels;
  cl_uint numKernels;
  cl_int errorCode;
  lock_guard<std::mutex> lock;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  lock_guard<std::mutex> *in_stack_fffffffffffffd10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd18;
  string *in_stack_fffffffffffffd28;
  Services_Common *in_stack_fffffffffffffd30;
  cl_program in_stack_fffffffffffffd38;
  CLIntercept *in_stack_fffffffffffffd40;
  cl_int in_stack_fffffffffffffd48;
  cl_int in_stack_fffffffffffffd4c;
  Services_Common *in_stack_fffffffffffffd50;
  char *pcVar3;
  uint local_234;
  string local_230 [32];
  string local_210 [32];
  ulong local_1f0;
  string local_1e8 [32];
  cl_program local_1c8;
  undefined8 local_1c0;
  uint local_1b4;
  Services_Common *local_1b0;
  cl_kernel local_1a8;
  uint local_19c;
  char local_198 [232];
  size_t size;
  void *ptr;
  undefined8 uVar4;
  string *in_stack_ffffffffffffff68;
  CLIntercept *in_stack_ffffffffffffff70;
  string local_70 [32];
  mapped_type *local_50;
  void *local_48;
  uint local_40;
  uint local_3c;
  cl_kernel *local_38;
  cl_uint local_20;
  int local_1c;
  cl_program local_10;
  
  local_10 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard
            (in_stack_fffffffffffffd10,
             (mutex_type *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  local_1c = 0;
  local_20 = 0;
  pcVar1 = dispatch(in_RDI);
  local_1c = (*pcVar1->clCreateKernelsInProgram)(local_10,0,(cl_kernel *)0x0,&local_20);
  local_38 = (cl_kernel *)0x0;
  if ((local_1c == 0) && (local_20 != 0)) {
    local_38 = (cl_kernel *)operator_new__((ulong)local_20 << 3);
    if (local_38 == (cl_kernel *)0x0) {
      local_1c = -6;
    }
    else {
      for (local_3c = 0; local_3c < local_20; local_3c = local_3c + 1) {
        local_38[local_3c] = (cl_kernel)0x0;
      }
      pcVar1 = dispatch(in_RDI);
      local_1c = (*pcVar1->clCreateKernelsInProgram)(local_10,local_20,local_38,(cl_uint *)0x0);
    }
  }
  local_40 = 0;
  local_48 = (void *)0x0;
  if (local_1c == 0) {
    local_1c = allocateAndGetProgramDeviceList
                         (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                          (cl_uint *)in_stack_fffffffffffffd30,
                          (cl_device_id **)in_stack_fffffffffffffd28);
  }
  if (((local_1c == 0) && (local_10 != (cl_program)0x0)) && (local_38 != (cl_kernel *)0x0)) {
    local_50 = std::
               map<_cl_program_*,_CLIntercept::SProgramInfo,_std::less<_cl_program_*>,_std::allocator<std::pair<_cl_program_*const,_CLIntercept::SProgramInfo>_>_>
               ::operator[]((map<_cl_program_*,_CLIntercept::SProgramInfo,_std::less<_cl_program_*>,_std::allocator<std::pair<_cl_program_*const,_CLIntercept::SProgramInfo>_>_>
                             *)in_stack_fffffffffffffd50,
                            (key_type *)
                            CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    std::__cxx11::string::string(local_70);
    OS(in_RDI);
    pcVar3 = sc_DumpDirectoryName;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff70,pcVar3,(allocator *)&stack0xffffffffffffff6f);
    ::OS::Services_Common::GetDumpDirectoryName
              (in_stack_fffffffffffffd50,
               (string *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
               (string *)in_stack_fffffffffffffd40);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
    pcVar3 = (char *)0x0;
    ptr = (void *)0x0;
    uVar4 = 0;
    local_198[0xe0] = '\0';
    local_198[0xe1] = '\0';
    local_198[0xe2] = '\0';
    local_198[0xe3] = '\0';
    local_198[0xe4] = '\0';
    local_198[0xe5] = '\0';
    local_198[0xe6] = '\0';
    local_198[0xe7] = '\0';
    size = 0;
    local_198[0xd0] = '\0';
    local_198[0xd1] = '\0';
    local_198[0xd2] = '\0';
    local_198[0xd3] = '\0';
    local_198[0xd4] = '\0';
    local_198[0xd5] = '\0';
    local_198[0xd6] = '\0';
    local_198[0xd7] = '\0';
    local_198[0xd8] = '\0';
    local_198[0xd9] = '\0';
    local_198[0xda] = '\0';
    local_198[0xdb] = '\0';
    local_198[0xdc] = '\0';
    local_198[0xdd] = '\0';
    local_198[0xde] = '\0';
    local_198[0xdf] = '\0';
    local_198[0xc0] = '\0';
    local_198[0xc1] = '\0';
    local_198[0xc2] = '\0';
    local_198[0xc3] = '\0';
    local_198[0xc4] = '\0';
    local_198[0xc5] = '\0';
    local_198[0xc6] = '\0';
    local_198[199] = '\0';
    local_198[200] = '\0';
    local_198[0xc9] = '\0';
    local_198[0xca] = '\0';
    local_198[0xcb] = '\0';
    local_198[0xcc] = '\0';
    local_198[0xcd] = '\0';
    local_198[0xce] = '\0';
    local_198[0xcf] = '\0';
    local_198[0xb0] = '\0';
    local_198[0xb1] = '\0';
    local_198[0xb2] = '\0';
    local_198[0xb3] = '\0';
    local_198[0xb4] = '\0';
    local_198[0xb5] = '\0';
    local_198[0xb6] = '\0';
    local_198[0xb7] = '\0';
    local_198[0xb8] = '\0';
    local_198[0xb9] = '\0';
    local_198[0xba] = '\0';
    local_198[0xbb] = '\0';
    local_198[0xbc] = '\0';
    local_198[0xbd] = '\0';
    local_198[0xbe] = '\0';
    local_198[0xbf] = '\0';
    local_198[0xa0] = '\0';
    local_198[0xa1] = '\0';
    local_198[0xa2] = '\0';
    local_198[0xa3] = '\0';
    local_198[0xa4] = '\0';
    local_198[0xa5] = '\0';
    local_198[0xa6] = '\0';
    local_198[0xa7] = '\0';
    local_198[0xa8] = '\0';
    local_198[0xa9] = '\0';
    local_198[0xaa] = '\0';
    local_198[0xab] = '\0';
    local_198[0xac] = '\0';
    local_198[0xad] = '\0';
    local_198[0xae] = '\0';
    local_198[0xaf] = '\0';
    local_198[0x90] = '\0';
    local_198[0x91] = '\0';
    local_198[0x92] = '\0';
    local_198[0x93] = '\0';
    local_198[0x94] = '\0';
    local_198[0x95] = '\0';
    local_198[0x96] = '\0';
    local_198[0x97] = '\0';
    local_198[0x98] = '\0';
    local_198[0x99] = '\0';
    local_198[0x9a] = '\0';
    local_198[0x9b] = '\0';
    local_198[0x9c] = '\0';
    local_198[0x9d] = '\0';
    local_198[0x9e] = '\0';
    local_198[0x9f] = '\0';
    local_198[0x80] = '\0';
    local_198[0x81] = '\0';
    local_198[0x82] = '\0';
    local_198[0x83] = '\0';
    local_198[0x84] = '\0';
    local_198[0x85] = '\0';
    local_198[0x86] = '\0';
    local_198[0x87] = '\0';
    local_198[0x88] = '\0';
    local_198[0x89] = '\0';
    local_198[0x8a] = '\0';
    local_198[0x8b] = '\0';
    local_198[0x8c] = '\0';
    local_198[0x8d] = '\0';
    local_198[0x8e] = '\0';
    local_198[0x8f] = '\0';
    local_198[0x70] = '\0';
    local_198[0x71] = '\0';
    local_198[0x72] = '\0';
    local_198[0x73] = '\0';
    local_198[0x74] = '\0';
    local_198[0x75] = '\0';
    local_198[0x76] = '\0';
    local_198[0x77] = '\0';
    local_198[0x78] = '\0';
    local_198[0x79] = '\0';
    local_198[0x7a] = '\0';
    local_198[0x7b] = '\0';
    local_198[0x7c] = '\0';
    local_198[0x7d] = '\0';
    local_198[0x7e] = '\0';
    local_198[0x7f] = '\0';
    local_198[0x60] = '\0';
    local_198[0x61] = '\0';
    local_198[0x62] = '\0';
    local_198[99] = '\0';
    local_198[100] = '\0';
    local_198[0x65] = '\0';
    local_198[0x66] = '\0';
    local_198[0x67] = '\0';
    local_198[0x68] = '\0';
    local_198[0x69] = '\0';
    local_198[0x6a] = '\0';
    local_198[0x6b] = '\0';
    local_198[0x6c] = '\0';
    local_198[0x6d] = '\0';
    local_198[0x6e] = '\0';
    local_198[0x6f] = '\0';
    local_198[0x50] = '\0';
    local_198[0x51] = '\0';
    local_198[0x52] = '\0';
    local_198[0x53] = '\0';
    local_198[0x54] = '\0';
    local_198[0x55] = '\0';
    local_198[0x56] = '\0';
    local_198[0x57] = '\0';
    local_198[0x58] = '\0';
    local_198[0x59] = '\0';
    local_198[0x5a] = '\0';
    local_198[0x5b] = '\0';
    local_198[0x5c] = '\0';
    local_198[0x5d] = '\0';
    local_198[0x5e] = '\0';
    local_198[0x5f] = '\0';
    local_198[0x40] = '\0';
    local_198[0x41] = '\0';
    local_198[0x42] = '\0';
    local_198[0x43] = '\0';
    local_198[0x44] = '\0';
    local_198[0x45] = '\0';
    local_198[0x46] = '\0';
    local_198[0x47] = '\0';
    local_198[0x48] = '\0';
    local_198[0x49] = '\0';
    local_198[0x4a] = '\0';
    local_198[0x4b] = '\0';
    local_198[0x4c] = '\0';
    local_198[0x4d] = '\0';
    local_198[0x4e] = '\0';
    local_198[0x4f] = '\0';
    local_198[0x30] = '\0';
    local_198[0x31] = '\0';
    local_198[0x32] = '\0';
    local_198[0x33] = '\0';
    local_198[0x34] = '\0';
    local_198[0x35] = '\0';
    local_198[0x36] = '\0';
    local_198[0x37] = '\0';
    local_198[0x38] = '\0';
    local_198[0x39] = '\0';
    local_198[0x3a] = '\0';
    local_198[0x3b] = '\0';
    local_198[0x3c] = '\0';
    local_198[0x3d] = '\0';
    local_198[0x3e] = '\0';
    local_198[0x3f] = '\0';
    local_198[0x20] = '\0';
    local_198[0x21] = '\0';
    local_198[0x22] = '\0';
    local_198[0x23] = '\0';
    local_198[0x24] = '\0';
    local_198[0x25] = '\0';
    local_198[0x26] = '\0';
    local_198[0x27] = '\0';
    local_198[0x28] = '\0';
    local_198[0x29] = '\0';
    local_198[0x2a] = '\0';
    local_198[0x2b] = '\0';
    local_198[0x2c] = '\0';
    local_198[0x2d] = '\0';
    local_198[0x2e] = '\0';
    local_198[0x2f] = '\0';
    local_198[0x10] = '\0';
    local_198[0x11] = '\0';
    local_198[0x12] = '\0';
    local_198[0x13] = '\0';
    local_198[0x14] = '\0';
    local_198[0x15] = '\0';
    local_198[0x16] = '\0';
    local_198[0x17] = '\0';
    local_198[0x18] = '\0';
    local_198[0x19] = '\0';
    local_198[0x1a] = '\0';
    local_198[0x1b] = '\0';
    local_198[0x1c] = '\0';
    local_198[0x1d] = '\0';
    local_198[0x1e] = '\0';
    local_198[0x1f] = '\0';
    local_198[0] = '\0';
    local_198[1] = '\0';
    local_198[2] = '\0';
    local_198[3] = '\0';
    local_198[4] = '\0';
    local_198[5] = '\0';
    local_198[6] = '\0';
    local_198[7] = '\0';
    local_198[8] = '\0';
    local_198[9] = '\0';
    local_198[10] = '\0';
    local_198[0xb] = '\0';
    local_198[0xc] = '\0';
    local_198[0xd] = '\0';
    local_198[0xe] = '\0';
    local_198[0xf] = '\0';
    pSVar2 = config(in_RDI);
    if ((pSVar2->OmitProgramNumber & 1U) == 0) {
      snprintf(local_198,0x100,"%04u_%08X_%04u_%08X_",(ulong)local_50->ProgramNumber,
               local_50->ProgramHash & 0xffffffff,(ulong)local_50->CompileCount,
               (int)local_50->OptionsHash);
    }
    else {
      snprintf(local_198,0x100,"%08X_%04u_%08X_",local_50->ProgramHash & 0xffffffff,
               (ulong)local_50->CompileCount,local_50->OptionsHash & 0xffffffff);
    }
    std::__cxx11::string::operator+=(local_70,"/CLI_");
    std::__cxx11::string::operator+=(local_70,local_198);
    this_00 = (CLIntercept *)OS(in_RDI);
    ::OS::Services_Common::MakeDumpDirectories(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    for (local_19c = 0; local_19c < local_20; local_19c = local_19c + 1) {
      local_1a8 = local_38[local_19c];
      local_1b0 = (Services_Common *)0x0;
      if (local_1c == 0) {
        in_stack_fffffffffffffd4c =
             allocateAndGetKernelInfoString
                       (this_00,(cl_kernel)
                                CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                        (cl_kernel_info)((ulong)in_stack_fffffffffffffd40 >> 0x20),
                        (char **)in_stack_fffffffffffffd38);
        local_1c = in_stack_fffffffffffffd4c;
      }
      for (local_1b4 = 0; local_1b4 < local_40; local_1b4 = local_1b4 + 1) {
        local_1c0 = 0;
        local_1c8 = (cl_program)0x0;
        if (local_1c == 0) {
          in_stack_fffffffffffffd48 =
               allocateAndGetKernelISABinary
                         (this_00,(cl_kernel)
                                  CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                          (cl_device_id)in_stack_fffffffffffffd40,
                          (size_t *)in_stack_fffffffffffffd38,(char **)in_stack_fffffffffffffd30);
          local_1c = in_stack_fffffffffffffd48;
        }
        if (local_1c == 0) {
          std::__cxx11::string::string(local_1e8,local_70);
          local_1f0 = 1;
          in_stack_fffffffffffffd40 = (CLIntercept *)dispatch(in_RDI);
          (**(cl_api_clGetDeviceInfo *)
             ((long)&(in_stack_fffffffffffffd40->m_Mutex).super___mutex_base._M_mutex + 0x10))
                    (*(cl_device_id *)((long)local_48 + (ulong)local_1b4 * 8),0x1000,8,&local_1f0,
                     (size_t *)0x0);
          if ((local_1f0 & 2) != 0) {
            std::__cxx11::string::operator+=(local_1e8,"CPU_");
          }
          if ((local_1f0 & 4) != 0) {
            std::__cxx11::string::operator+=(local_1e8,"GPU_");
          }
          if ((local_1f0 & 8) != 0) {
            std::__cxx11::string::operator+=(local_1e8,"ACC_");
          }
          if ((local_1f0 & 0x10) != 0) {
            std::__cxx11::string::operator+=(local_1e8,"CUSTOM_");
          }
          std::__cxx11::string::operator+=(local_1e8,(char *)local_1b0);
          std::__cxx11::string::operator+=(local_1e8,".isabin");
          std::operator+(pcVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )this_00);
          __x = (double)std::operator+(in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10);
          log(in_RDI,__x);
          std::__cxx11::string::~string(local_210);
          std::__cxx11::string::~string(local_230);
          dumpMemoryToFile(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                           SUB81((ulong)uVar4 >> 0x38,0),ptr,size);
          std::__cxx11::string::~string(local_1e8);
        }
        in_stack_fffffffffffffd38 = local_1c8;
        if (local_1c8 != (cl_program)0x0) {
          operator_delete__(local_1c8);
          in_stack_fffffffffffffd38 = local_1c8;
        }
        local_1c8 = (cl_program)0x0;
      }
      in_stack_fffffffffffffd30 = local_1b0;
      if (local_1b0 != (Services_Common *)0x0) {
        operator_delete__(local_1b0);
        in_stack_fffffffffffffd30 = local_1b0;
      }
      local_1b0 = (Services_Common *)0x0;
    }
    std::__cxx11::string::~string(local_70);
  }
  if (local_38 != (cl_kernel *)0x0) {
    for (local_234 = 0; local_234 < local_20; local_234 = local_234 + 1) {
      if (local_38[local_234] != (cl_kernel)0x0) {
        pcVar1 = dispatch(in_RDI);
        (*pcVar1->clReleaseKernel)(local_38[local_234]);
        local_38[local_234] = (cl_kernel)0x0;
      }
    }
  }
  if (local_38 != (cl_kernel *)0x0) {
    operator_delete__(local_38);
  }
  local_38 = (cl_kernel *)0x0;
  if (local_48 != (void *)0x0) {
    operator_delete__(local_48);
  }
  local_48 = (void *)0x0;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x218470);
  return;
}

Assistant:

void CLIntercept::dumpKernelISABinaries(
    const cl_program program )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_int  errorCode = CL_SUCCESS;

    // Since the kernel ISA binaries are retrieved via kernel queries, the first
    // thing we need to do is to create the kernels for this program.

    cl_uint numKernels = 0;
    if( errorCode == CL_SUCCESS )
    {
        errorCode = dispatch().clCreateKernelsInProgram(
            program,
            0,
            NULL,
            &numKernels );
    }
    cl_kernel*  kernels = NULL;
    if( errorCode == CL_SUCCESS && numKernels != 0 )
    {
        kernels = new cl_kernel[ numKernels ];
        if( kernels )
        {
            for( cl_uint k = 0; k < numKernels; k++ )
            {
                kernels[k] = NULL;
            }
            errorCode = dispatch().clCreateKernelsInProgram(
                program,
                numKernels,
                kernels,
                NULL );
        }
        else
        {
            errorCode = CL_OUT_OF_HOST_MEMORY;
        }
    }

    // Also, get the list of devices for the program.
    cl_uint         numDevices = 0;
    cl_device_id*   deviceList = NULL;
    if( errorCode == CL_SUCCESS )
    {
        errorCode = allocateAndGetProgramDeviceList(
            program,
            numDevices,
            deviceList );
    }

    if( errorCode == CL_SUCCESS && program != NULL && kernels != NULL )
    {
        const SProgramInfo& programInfo = m_ProgramInfoMap[ program ];

        std::string fileNamePrefix;

        // Get the dump directory name.
        {
            OS().GetDumpDirectoryName( sc_DumpDirectoryName, fileNamePrefix );
        }
        // Make the file name prefix.  It will have the form:
        //   CLI_<program number>_<program hash>_<compile count>_<options hash>_<device type>_<kernel name>.isabin
        // We'll fill in the device type and kernel name later.
        {
            char    numberString[256] = "";

            if( config().OmitProgramNumber )
            {
                CLI_SPRINTF( numberString, 256, "%08X_%04u_%08X_",
                    (unsigned int)programInfo.ProgramHash,
                    programInfo.CompileCount,
                    (unsigned int)programInfo.OptionsHash );
            }
            else
            {
                CLI_SPRINTF( numberString, 256, "%04u_%08X_%04u_%08X_",
                    programInfo.ProgramNumber,
                    (unsigned int)programInfo.ProgramHash,
                    programInfo.CompileCount,
                    (unsigned int)programInfo.OptionsHash );
            }

            fileNamePrefix += "/CLI_";
            fileNamePrefix += numberString;
        }
        // Now make directories as appropriate.
        {
            OS().MakeDumpDirectories( fileNamePrefix );
        }

        for( cl_uint k = 0; k < numKernels; k++ )
        {
            cl_kernel   kernel = kernels[ k ];

            // Get the kernel name.  We can't use the kernel name map yet, so
            // use a kernel query instead.
            char* kernelName = NULL;
            if( errorCode == CL_SUCCESS )
            {
                errorCode = allocateAndGetKernelInfoString(
                    kernel,
                    CL_KERNEL_FUNCTION_NAME,
                    kernelName );
            }

            for( cl_uint d = 0; d < numDevices; d++ )
            {
                size_t      kernelISABinarySize = 0;
                char*       kernelISABinary = NULL;

                if( errorCode == CL_SUCCESS )
                {
                    errorCode = allocateAndGetKernelISABinary(
                        kernel,
                        deviceList[d],
                        kernelISABinarySize,
                        kernelISABinary );
                }

                if( errorCode == CL_SUCCESS )
                {
                    std::string fileName( fileNamePrefix );

                    cl_device_type  deviceType = CL_DEVICE_TYPE_DEFAULT;

                    // It's OK if this fails.  If it does, it just
                    // means that our output file won't have a device
                    // type.
                    dispatch().clGetDeviceInfo(
                        deviceList[d],
                        CL_DEVICE_TYPE,
                        sizeof( deviceType ),
                        &deviceType,
                        NULL );

                    if( deviceType & CL_DEVICE_TYPE_CPU )
                    {
                        fileName += "CPU_";
                    }
                    if( deviceType & CL_DEVICE_TYPE_GPU )
                    {
                        fileName += "GPU_";
                    }
                    if( deviceType & CL_DEVICE_TYPE_ACCELERATOR )
                    {
                        fileName += "ACC_";
                    }
                    if( deviceType & CL_DEVICE_TYPE_CUSTOM )
                    {
                        fileName+= "CUSTOM_";
                    }

                    fileName += kernelName;
                    fileName += ".isabin";

                    log( "Dumping kernel ISA binary to file: " + fileName + "\n" );
                    dumpMemoryToFile(
                        fileName,
                        false,
                        kernelISABinary,
                        kernelISABinarySize );
                }

                delete [] kernelISABinary;
                kernelISABinary = NULL;
            }

            delete [] kernelName;
            kernelName = NULL;
        }
    }

    // If we have kernels, release them.
    if( kernels )
    {
        for( cl_uint k = 0; k < numKernels; k++ )
        {
            if( kernels[k] )
            {
                dispatch().clReleaseKernel( kernels[k] );
                kernels[k] = NULL;
            }
        }
    }

    delete [] kernels;
    kernels = NULL;

    delete [] deviceList;
    deviceList = NULL;
}